

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormatLite::Int32Size(RepeatedField<int> *value)

{
  int n;
  int *data;
  size_t sVar1;
  bool is_soo;
  
  if ((undefined1  [16])((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    data = &(value->soo_rep_).field_0.long_rep.size;
    is_soo = true;
  }
  else {
    data = (int *)LongSooRep::elements((LongSooRep *)value);
    is_soo = (undefined1  [16])((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4)
             == (undefined1  [16])0x0;
  }
  n = SooRep::size(&value->soo_rep_,is_soo);
  sVar1 = VarintSize<false,true,int>(data,n);
  return sVar1;
}

Assistant:

size_t WireFormatLite::Int32Size(const RepeatedField<int32_t>& value) {
  return VarintSize<false, true>(value.data(), value.size());
}